

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O3

bool __thiscall
libcellml::Component::ComponentImpl::equalResets(ComponentImpl *this,ComponentPtr *other)

{
  bool bVar1;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  entities;
  EntityPtr local_38;
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  local_28;
  
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::shared_ptr<libcellml::Reset>const*,std::back_insert_iterator<std::vector<std::shared_ptr<libcellml::Entity>,std::allocator<std::shared_ptr<libcellml::Entity>>>>>
            ((this->mResets).
             super__Vector_base<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->mResets).
             super__Vector_base<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_28);
  local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (other->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (other->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  bVar1 = equalEntities(&local_38,&local_28);
  if (local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<libcellml::Entity>,_std::allocator<std::shared_ptr<libcellml::Entity>_>_>::
  ~vector(&local_28);
  return bVar1;
}

Assistant:

bool Component::ComponentImpl::equalResets(const ComponentPtr &other) const
{
    std::vector<EntityPtr> entities;
    std::copy(mResets.begin(), mResets.end(), std::back_inserter(entities));
    return equalEntities(other, entities);
}